

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProcedure::IfcProcedure(IfcProcedure *this)

{
  *(undefined ***)&this->field_0x158 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcProcedure";
  IfcProcess::IfcProcess((IfcProcess *)this,&PTR_construction_vtable_24__00748078);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x747f98;
  *(undefined8 *)&this->field_0x158 = 0x748060;
  *(undefined8 *)&this->field_0x88 = 0x747fc0;
  *(undefined8 *)&this->field_0x98 = 0x747fe8;
  *(undefined8 *)&this->field_0xd0 = 0x748010;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0x748038;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x20 = 0;
  (this->ProcedureType)._M_dataplus._M_p = (pointer)&(this->ProcedureType).field_2;
  (this->ProcedureType)._M_string_length = 0;
  (this->ProcedureType).field_2._M_local_buf[0] = '\0';
  (this->UserDefinedProcedureType).ptr._M_dataplus._M_p =
       (pointer)&(this->UserDefinedProcedureType).ptr.field_2;
  (this->UserDefinedProcedureType).ptr._M_string_length = 0;
  (this->UserDefinedProcedureType).ptr.field_2._M_local_buf[0] = '\0';
  (this->UserDefinedProcedureType).have = false;
  return;
}

Assistant:

IfcProcedure() : Object("IfcProcedure") {}